

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O0

bool soul::containsChar(char *s,char c)

{
  char *pcStack_18;
  char c_local;
  char *s_local;
  
  pcStack_18 = s;
  if (s != (char *)0x0) {
    for (; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1) {
      if (*pcStack_18 == c) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool containsChar (const char* s, char c) noexcept
{
    if (s == nullptr)
        return false;

    for (; *s != 0; ++s)
        if (*s == c)
            return true;

    return false;
}